

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

size_t __thiscall tf::Node::num_strong_dependencies(Node *this)

{
  bool bVar1;
  size_type sVar2;
  Node *in_RDI;
  size_t i;
  size_t n;
  ulong idx;
  ulong local_18;
  size_t local_10;
  
  local_10 = 0;
  local_18 = in_RDI->_num_successors;
  while( true ) {
    idx = local_18;
    sVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::size
                      ((SmallVectorTemplateCommon<tf::Node_*,_void> *)in_RDI);
    if (sVar2 <= idx) break;
    SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
              ((SmallVectorTemplateCommon<tf::Node_*,_void> *)in_RDI,idx);
    bVar1 = _is_conditioner(in_RDI);
    local_10 = ((bVar1 ^ 0xffU) & 1) + local_10;
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

inline size_t Node::num_strong_dependencies() const {
  size_t n = 0;
  for(size_t i=_num_successors; i<_edges.size(); i++) {
    n += !_edges[i]->_is_conditioner();
  }
  return n;
}